

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O0

bool gutil::skip(istream *in,char *expected)

{
  bool bVar1;
  ulong uVar2;
  istream *in_RDI;
  string s;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  string *this;
  string local_38 [40];
  istream *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) != 0) {
    this = local_38;
    std::__cxx11::string::string(this);
    std::operator>>(local_10,this);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  in_stack_ffffffffffffffa8));
    if (bVar1) {
      local_1 = 1;
    }
    else {
      std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
    }
    std::__cxx11::string::~string(local_38);
    if (bVar1) goto LAB_001a43d0;
  }
  local_1 = 0;
LAB_001a43d0:
  return (bool)(local_1 & 1);
}

Assistant:

bool gutil::skip(std::istream &in, const char *expected)
{
  if (in.good())
  {
    std::string s;
    in >> s;

    if (s == expected)
    {
      return true;
    }

#ifndef NDEBUG
    std::cerr << "gutil::skip() expected '" << expected << "' but got '" << s << "'" << std::endl;
#endif

    in.setstate(std::ios_base::failbit);
  }

  return false;
}